

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

uint * Abc_NodeSuperChoiceTruth(Abc_ManScl_t *pManScl)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_40;
  int local_3c;
  int k;
  int i;
  char *pSop;
  uint *puData;
  uint *puData1;
  uint *puData0;
  Abc_Obj_t *pObj;
  Abc_ManScl_t *pManScl_local;
  
  pSop = (char *)0x0;
  for (local_3c = 0; iVar2 = Vec_PtrSize(pManScl->vLeaves), local_3c < iVar2;
      local_3c = local_3c + 1) {
    pvVar3 = Vec_PtrEntry(pManScl->vLeaves,local_3c);
    *(uint **)((long)pvVar3 + 8) = pManScl->uVars[local_3c];
  }
  for (local_3c = 0; iVar2 = Vec_PtrSize(pManScl->vVolume), local_3c < iVar2;
      local_3c = local_3c + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(pManScl->vVolume,local_3c);
    pObj_00->pNext = (Abc_Obj_t *)pManScl->uSims[local_3c];
    pSop = (char *)pObj_00->pNext;
    pAVar4 = Abc_ObjFanin0(pObj_00);
    pAVar4 = pAVar4->pNext;
    pAVar5 = Abc_ObjFanin1(pObj_00);
    pAVar5 = pAVar5->pNext;
    pcVar1 = (char *)(pObj_00->field_5).pData;
    if ((*pcVar1 == '0') && (pcVar1[1] == '0')) {
      for (local_40 = 0; local_40 < pManScl->nWords; local_40 = local_40 + 1) {
        *(uint *)((long)&((Abc_Obj_t *)pSop)->pNtk + (long)local_40 * 4) =
             (*(uint *)((long)&pAVar4->pNtk + (long)local_40 * 4) ^ 0xffffffff) &
             (*(uint *)((long)&pAVar5->pNtk + (long)local_40 * 4) ^ 0xffffffff);
      }
    }
    else if (*pcVar1 == '0') {
      for (local_40 = 0; local_40 < pManScl->nWords; local_40 = local_40 + 1) {
        *(uint *)((long)&((Abc_Obj_t *)pSop)->pNtk + (long)local_40 * 4) =
             (*(uint *)((long)&pAVar4->pNtk + (long)local_40 * 4) ^ 0xffffffff) &
             *(uint *)((long)&pAVar5->pNtk + (long)local_40 * 4);
      }
    }
    else if (pcVar1[1] == '0') {
      for (local_40 = 0; local_40 < pManScl->nWords; local_40 = local_40 + 1) {
        *(uint *)((long)&((Abc_Obj_t *)pSop)->pNtk + (long)local_40 * 4) =
             *(uint *)((long)&pAVar4->pNtk + (long)local_40 * 4) &
             (*(uint *)((long)&pAVar5->pNtk + (long)local_40 * 4) ^ 0xffffffff);
      }
    }
    else {
      for (local_40 = 0; local_40 < pManScl->nWords; local_40 = local_40 + 1) {
        *(uint *)((long)&((Abc_Obj_t *)pSop)->pNtk + (long)local_40 * 4) =
             *(uint *)((long)&pAVar4->pNtk + (long)local_40 * 4) &
             *(uint *)((long)&pAVar5->pNtk + (long)local_40 * 4);
      }
    }
  }
  return (uint *)pSop;
}

Assistant:

unsigned * Abc_NodeSuperChoiceTruth( Abc_ManScl_t * pManScl )
{
    Abc_Obj_t * pObj;
    unsigned * puData0, * puData1, * puData = NULL;
    char * pSop;
    int i, k;
    // set elementary truth tables
    Vec_PtrForEachEntry( Abc_Obj_t *, pManScl->vLeaves, pObj, i )
        pObj->pNext = (Abc_Obj_t *)pManScl->uVars[i];
    // compute truth tables for internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, pManScl->vVolume, pObj, i )
    {
        // set storage for the node's simulation info
        pObj->pNext = (Abc_Obj_t *)pManScl->uSims[i];
        // get pointer to the simulation info
        puData  = (unsigned *)pObj->pNext;
        puData0 = (unsigned *)Abc_ObjFanin0(pObj)->pNext;
        puData1 = (unsigned *)Abc_ObjFanin1(pObj)->pNext;
        // simulate
        pSop = (char *)pObj->pData;
        if ( pSop[0] == '0' && pSop[1] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = ~puData0[k] & ~puData1[k];
        else if ( pSop[0] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = ~puData0[k] & puData1[k];
        else if ( pSop[1] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = puData0[k] & ~puData1[k];
        else 
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = puData0[k] & puData1[k];
    }
    return puData;
}